

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O2

void __thiscall
QDistanceField::setGlyph(QDistanceField *this,QRawFont *font,glyph_t glyph,bool doubleResolution)

{
  long lVar1;
  int iVar2;
  int iVar3;
  QDistanceFieldData *pQVar4;
  long in_FS_OFFSET;
  QRectF local_78;
  QPointF local_58;
  QPainterPath path;
  QRawFont renderFont;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  renderFont.d.d.ptr = (QExplicitlySharedDataPointer<QRawFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QRawFont::QRawFont(&renderFont,font);
  iVar2 = QT_DISTANCEFIELD_BASEFONTSIZE(doubleResolution);
  iVar3 = QT_DISTANCEFIELD_SCALE(doubleResolution);
  QRawFont::setPixelSize(&renderFont,(double)(iVar3 * iVar2));
  path.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QRawFont::pathForGlyph((QRawFont *)&path,(quint32)&renderFont);
  QPainterPath::boundingRect(&local_78,&path);
  local_58.xp._4_4_ = local_78.xp._4_4_ ^ 0x80000000;
  local_58.yp._4_4_ = local_78.yp._4_4_ ^ 0x80000000;
  local_58.xp._0_4_ = local_78.xp._0_4_;
  local_58.yp._0_4_ = local_78.yp._0_4_;
  QPainterPath::translate(&path,&local_58);
  QPainterPath::setFillRule(&path,WindingFill);
  pQVar4 = QDistanceFieldData::create(&path,doubleResolution);
  QSharedDataPointer<QDistanceFieldData>::reset(&this->d,pQVar4);
  pQVar4 = QSharedDataPointer<QDistanceFieldData>::operator->(&this->d);
  pQVar4->glyph = glyph;
  QPainterPath::~QPainterPath(&path);
  QRawFont::~QRawFont(&renderFont);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDistanceField::setGlyph(const QRawFont &font, glyph_t glyph, bool doubleResolution)
{
    QRawFont renderFont = font;
    renderFont.setPixelSize(QT_DISTANCEFIELD_BASEFONTSIZE(doubleResolution) * QT_DISTANCEFIELD_SCALE(doubleResolution));

    QPainterPath path = renderFont.pathForGlyph(glyph);
    path.translate(-path.boundingRect().topLeft());
    path.setFillRule(Qt::WindingFill);

    d = QDistanceFieldData::create(path, doubleResolution);
    d->glyph = glyph;
}